

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_serial.cpp
# Opt level: O3

int SerialDataInOutputQueue(int port)

{
  int __fd;
  int bytes;
  int local_c;
  
  local_c = 0;
  __fd = fd_map[port];
  if (-1 < __fd) {
    ioctl(__fd,0x5411,&local_c);
    __fd = local_c;
  }
  return __fd;
}

Assistant:

int SerialDataInOutputQueue(int port) {
    int bytes = 0;
    int fd = FindFD(port);

    if (fd < 0)            ///< error
        return fd;

    ioctl(fd, TIOCOUTQ, &bytes);
    return bytes;
}